

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O3

DdNode * Kit_GraphToBdd(DdManager *dd,Kit_Graph_t *pGraph)

{
  uint uVar1;
  Kit_Node_t *pKVar2;
  int iVar3;
  DdNode *pDVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  long lVar10;
  
  uVar1 = pGraph->nLeaves;
  if ((int)uVar1 < 0) {
    __assert_fail("Kit_GraphLeaveNum(pGraph) >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                  ,0x67,"DdNode *Kit_GraphToBdd(DdManager *, Kit_Graph_t *)");
  }
  iVar3 = pGraph->nSize;
  if ((int)uVar1 <= iVar3) {
    if (pGraph->fConst == 0) {
      uVar6 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
      if (uVar6 < uVar1) {
        pDVar4 = Cudd_bddIthVar(dd,uVar6);
      }
      else {
        if (uVar1 == 0) {
          puVar9 = (undefined1 *)0x0;
          iVar5 = 0;
        }
        else {
          lVar10 = 0;
          lVar8 = -0x18;
          do {
            lVar7 = lVar8;
            pKVar2 = pGraph->pNodes;
            pDVar4 = Cudd_bddIthVar(dd,(int)lVar10);
            *(DdNode **)((long)&pKVar2[1].field_2 + lVar7) = pDVar4;
            lVar10 = lVar10 + 1;
            iVar5 = pGraph->nLeaves;
            lVar8 = lVar7 + 0x18;
          } while (lVar10 < iVar5);
          iVar3 = pGraph->nSize;
          puVar9 = &pKVar2[1].eEdge0.field_0x0 + lVar7;
        }
        if (iVar5 < iVar3) {
          lVar10 = (long)iVar5;
          lVar8 = lVar10 * 0x18 + -0x18;
          do {
            lVar7 = lVar8;
            pKVar2 = pGraph->pNodes;
            uVar1 = *(uint *)(&pKVar2[1].eEdge0.field_0x0 + lVar7);
            uVar6 = *(uint *)(&pKVar2[1].eEdge1.field_0x0 + lVar7);
            pDVar4 = Cudd_bddAnd(dd,(DdNode *)
                                    ((ulong)(uVar1 & 1) ^
                                    (ulong)pKVar2[uVar1 >> 1 & 0x3fffffff].field_2.pFunc),
                                 (DdNode *)
                                 ((ulong)(uVar6 & 1) ^
                                 (ulong)pKVar2[uVar6 >> 1 & 0x3fffffff].field_2.pFunc));
            *(DdNode **)((long)&pKVar2[1].field_2 + lVar7) = pDVar4;
            Cudd_Ref(pDVar4);
            lVar10 = lVar10 + 1;
            lVar8 = lVar7 + 0x18;
          } while (lVar10 < pGraph->nSize);
          puVar9 = &pKVar2[1].eEdge0.field_0x0 + lVar7;
        }
        pDVar4 = *(DdNode **)(puVar9 + 8);
        Cudd_Ref(pDVar4);
        lVar8 = (long)pGraph->nLeaves;
        if (pGraph->nLeaves < pGraph->nSize) {
          lVar10 = lVar8 * 0x18 + 8;
          do {
            Cudd_RecursiveDeref(dd,*(DdNode **)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar10));
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + 0x18;
          } while (lVar8 < pGraph->nSize);
        }
        Cudd_Deref(pDVar4);
      }
    }
    else {
      pDVar4 = dd->one;
    }
    return (DdNode *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pDVar4);
  }
  __assert_fail("Kit_GraphLeaveNum(pGraph) <= pGraph->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitBdd.c"
                ,0x68,"DdNode *Kit_GraphToBdd(DdManager *, Kit_Graph_t *)");
}

Assistant:

DdNode * Kit_GraphToBdd( DdManager * dd, Kit_Graph_t * pGraph )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    Kit_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i;

    // sanity checks
    assert( Kit_GraphLeaveNum(pGraph) >= 0 );
    assert( Kit_GraphLeaveNum(pGraph) <= pGraph->nSize );

    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Cudd_NotCond( b1, Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Cudd_NotCond( Cudd_bddIthVar(dd, Kit_GraphVarInt(pGraph)), Kit_GraphIsComplement(pGraph) );

    // assign the elementary variables
    Kit_GraphForEachLeaf( pGraph, pNode, i )
        pNode->pFunc = Cudd_bddIthVar( dd, i );

    // compute the function for each internal node
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        bFunc1 = Cudd_NotCond( Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( (DdNode *)pNode->pFunc );
    }

    // deref the intermediate results
    bFunc = (DdNode *)pNode->pFunc;   Cudd_Ref( bFunc );
    Kit_GraphForEachNode( pGraph, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pFunc );
    Cudd_Deref( bFunc );

    // complement the result if necessary
    return Cudd_NotCond( bFunc, Kit_GraphIsComplement(pGraph) );
}